

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDLImporter::CreateTextureARGB8_3DGS_MDL3(MDLImporter *this,uchar *szData)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  uchar *puVar4;
  aiTexture **ppaVar5;
  uchar (*in_RAX) [3];
  aiTexture *paVar6;
  aiTexel *paVar7;
  ulong uVar8;
  aiTexture **ppaVar9;
  aiScene *paVar10;
  ulong uVar11;
  uint uVar12;
  uchar *szColorMap;
  uchar (*local_38) [3];
  
  puVar4 = this->mBuffer;
  local_38 = in_RAX;
  SizeCheck(this,szData + (long)*(int *)(puVar4 + 0x38) * (long)*(int *)(puVar4 + 0x34),
            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
            ,0x8c);
  paVar6 = (aiTexture *)operator_new(0x428);
  paVar6->pcData = (aiTexel *)0x0;
  (paVar6->mFilename).length = 0;
  (paVar6->mFilename).data[0] = '\0';
  memset((paVar6->mFilename).data + 1,0x1b,0x3ff);
  paVar6->achFormatHint[0] = '\0';
  paVar6->achFormatHint[1] = '\0';
  paVar6->achFormatHint[2] = '\0';
  paVar6->achFormatHint[3] = '\0';
  uVar3 = *(uint *)(puVar4 + 0x34);
  paVar6->mWidth = uVar3;
  uVar12 = *(uint *)(puVar4 + 0x38);
  paVar6->mHeight = uVar12;
  uVar12 = uVar12 * uVar3;
  paVar7 = (aiTexel *)operator_new__((ulong)uVar12 * 4);
  paVar6->pcData = paVar7;
  SearchPalette(this,(uchar **)&local_38);
  if (uVar12 != 0) {
    uVar8 = 0;
    do {
      bVar2 = szData[uVar8];
      paVar7[uVar8].a = 0xff;
      paVar7[uVar8].r = local_38[bVar2][0];
      paVar7[uVar8].g = local_38[bVar2][1];
      paVar7[uVar8].b = local_38[bVar2][2];
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar12);
  }
  if (local_38 != (uchar (*) [3])0x0 && local_38 != g_aclrDefaultColorMap) {
    operator_delete__(local_38);
  }
  paVar10 = this->pScene;
  ppaVar5 = paVar10->mTextures;
  ppaVar9 = (aiTexture **)operator_new__((ulong)(paVar10->mNumTextures + 1) << 3);
  paVar10->mTextures = ppaVar9;
  paVar10 = this->pScene;
  if (paVar10->mNumTextures == 0) {
    uVar8 = 0;
  }
  else {
    uVar11 = 0;
    do {
      paVar10->mTextures[uVar11] = ppaVar5[uVar11];
      uVar11 = uVar11 + 1;
      paVar10 = this->pScene;
      uVar8 = (ulong)paVar10->mNumTextures;
    } while (uVar11 < uVar8);
  }
  paVar10->mTextures[uVar8] = paVar6;
  puVar1 = &this->pScene->mNumTextures;
  *puVar1 = *puVar1 + 1;
  if (ppaVar5 == (aiTexture **)0x0) {
    return;
  }
  operator_delete__(ppaVar5);
  return;
}

Assistant:

void MDLImporter::CreateTextureARGB8_3DGS_MDL3(const unsigned char* szData)
{
    const MDL::Header *pcHeader = (const MDL::Header*)mBuffer;  //the endianness is already corrected in the InternReadFile_3DGS_MDL345 function

    VALIDATE_FILE_SIZE(szData + pcHeader->skinwidth *
        pcHeader->skinheight);

    // allocate a new texture object
    aiTexture* pcNew = new aiTexture();
    pcNew->mWidth = pcHeader->skinwidth;
    pcNew->mHeight = pcHeader->skinheight;

    pcNew->pcData = new aiTexel[pcNew->mWidth * pcNew->mHeight];

    const unsigned char* szColorMap;
    this->SearchPalette(&szColorMap);

    // copy texture data
    for (unsigned int i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
    {
        const unsigned char val = szData[i];
        const unsigned char* sz = &szColorMap[val*3];

        pcNew->pcData[i].a = 0xFF;
        pcNew->pcData[i].r = *sz++;
        pcNew->pcData[i].g = *sz++;
        pcNew->pcData[i].b = *sz;
    }

    FreePalette(szColorMap);

    // store the texture
    aiTexture** pc = this->pScene->mTextures;
    this->pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
    for (unsigned int i = 0; i <pScene->mNumTextures;++i)
        pScene->mTextures[i] = pc[i];

    pScene->mTextures[this->pScene->mNumTextures] = pcNew;
    pScene->mNumTextures++;
    delete[] pc;
    return;
}